

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O0

void ecs_bulk_remove_entity(ecs_world_t *world,ecs_entity_t to_remove,ecs_filter_t *filter)

{
  _Bool _Var1;
  int32_t iVar2;
  ecs_table_t *table_00;
  ecs_table_t *dst_table_00;
  ecs_table_t *dst_table;
  ecs_table_t *table;
  int32_t count;
  int32_t i;
  ecs_entities_t removed;
  ecs_entity_t removed_entity;
  ecs_entities_t to_remove_array;
  ecs_stage_t *stage;
  ecs_filter_t *filter_local;
  ecs_entity_t to_remove_local;
  ecs_world_t *world_local;
  
  filter_local = (ecs_filter_t *)to_remove;
  to_remove_local = (ecs_entity_t)world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,299);
  if (to_remove_local == 0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,299,
                  "void ecs_bulk_remove_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)");
  }
  _ecs_assert(filter_local != (ecs_filter_t *)0x0,2,(char *)0x0,"to_remove != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,300);
  if (filter_local == (ecs_filter_t *)0x0) {
    __assert_fail("to_remove != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,300,
                  "void ecs_bulk_remove_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)");
  }
  to_remove_array._8_8_ = ecs_get_stage((ecs_world_t **)&to_remove_local);
  _ecs_assert((ecs_stage_t *)to_remove_array._8_8_ == (ecs_stage_t *)(to_remove_local + 0x5b08),0x23
              ,(char *)0x0,"stage == &world->stage",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0x12f);
  if (to_remove_array._8_8_ != to_remove_local + 0x5b08) {
    __assert_fail("stage == &world->stage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0x12f,
                  "void ecs_bulk_remove_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)");
  }
  removed_entity = (ecs_entity_t)&filter_local;
  to_remove_array.array._0_4_ = 1;
  _count = &removed.count;
  removed.array._0_4_ = 0;
  iVar2 = ecs_sparse_count(*(ecs_sparse_t **)(to_remove_local + 0x4830));
  table._4_4_ = 0;
  do {
    if (iVar2 <= table._4_4_) {
      return;
    }
    table_00 = (ecs_table_t *)
               _ecs_sparse_get(*(ecs_sparse_t **)(to_remove_local + 0x4830),0x80,table._4_4_);
    if (((table_00->flags & 1) == 0) &&
       (_Var1 = ecs_table_match_filter((ecs_world_t *)to_remove_local,table_00,filter), _Var1)) {
      dst_table_00 = ecs_table_traverse_remove
                               ((ecs_world_t *)to_remove_local,table_00,
                                (ecs_entities_t *)&removed_entity,(ecs_entities_t *)&count);
      _ecs_assert((int)removed.array <= (int)to_remove_array.array,0xc,(char *)0x0,
                  "removed.count <= to_remove_array.count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0x149);
      if ((int)to_remove_array.array < (int)removed.array) {
        __assert_fail("removed.count <= to_remove_array.count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                      ,0x149,
                      "void ecs_bulk_remove_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)"
                     );
      }
      if ((int)removed.array != 0) {
        _ecs_assert(dst_table_00 != (ecs_table_t *)0x0,0xc,(char *)0x0,"dst_table != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                    ,0x14f);
        if (dst_table_00 == (ecs_table_t *)0x0) {
          __assert_fail("dst_table != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                        ,0x14f,
                        "void ecs_bulk_remove_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)"
                       );
        }
        merge_table((ecs_world_t *)to_remove_local,dst_table_00,table_00,(ecs_entities_t *)0x0,
                    (ecs_entities_t *)&count);
        removed.array._0_4_ = 0;
      }
    }
    table._4_4_ = table._4_4_ + 1;
  } while( true );
}

Assistant:

void ecs_bulk_remove_entity(
    ecs_world_t *world,
    ecs_entity_t to_remove,
    const ecs_filter_t *filter)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(to_remove != 0, ECS_INVALID_PARAMETER, NULL);

    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_assert(stage == &world->stage, ECS_UNSUPPORTED, NULL);
    (void)stage;

    ecs_entities_t to_remove_array = { .array = &to_remove, .count = 1 };

    ecs_entity_t removed_entity;
    ecs_entities_t removed = {
        .array = &removed_entity,
        .count = 0
    };

    int32_t i, count = ecs_sparse_count(world->store.tables);
    for (i = 0; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(world->store.tables, ecs_table_t, i);

        if (table->flags & EcsTableHasBuiltins) {
            continue;
        }

        if (!ecs_table_match_filter(world, table, filter)) {
            continue;
        }            

        ecs_table_t *dst_table = ecs_table_traverse_remove(
            world, table, &to_remove_array, &removed);

        ecs_assert(removed.count <= to_remove_array.count, ECS_INTERNAL_ERROR, NULL);

        if (!removed.count) {
            continue;
        }

        ecs_assert(dst_table != NULL, ECS_INTERNAL_ERROR, NULL);   
        merge_table(world, dst_table, table, NULL, &removed);
        removed.count = 0;        
    }    
}